

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::anon_unknown_0::MergedDescriptorDatabaseTest_FindFileContainingExtension_Test::
~MergedDescriptorDatabaseTest_FindFileContainingExtension_Test
          (MergedDescriptorDatabaseTest_FindFileContainingExtension_Test *this)

{
  (this->super_MergedDescriptorDatabaseTest).super_Test._vptr_Test =
       (_func_int **)&PTR__MergedDescriptorDatabaseTest_018d40c8;
  MergedDescriptorDatabase::~MergedDescriptorDatabase
            (&(this->super_MergedDescriptorDatabaseTest).reverse_merged_);
  MergedDescriptorDatabase::~MergedDescriptorDatabase
            (&(this->super_MergedDescriptorDatabaseTest).forward_merged_);
  SimpleDescriptorDatabase::~SimpleDescriptorDatabase
            (&(this->super_MergedDescriptorDatabaseTest).database2_);
  SimpleDescriptorDatabase::~SimpleDescriptorDatabase
            (&(this->super_MergedDescriptorDatabaseTest).database1_);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x120);
  return;
}

Assistant:

TEST_F(MergedDescriptorDatabaseTest, FindFileContainingExtension) {
  {
    // Can find file that is only in database1_.
    FileDescriptorProto file;
    EXPECT_TRUE(forward_merged_.FindFileContainingExtension("Foo", 3, &file));
    EXPECT_EQ("foo.proto", file.name());
    ExpectContainsType(file, "Foo");
  }

  {
    // Can find file that is only in database2_.
    FileDescriptorProto file;
    EXPECT_TRUE(forward_merged_.FindFileContainingExtension("Bar", 5, &file));
    EXPECT_EQ("bar.proto", file.name());
    ExpectContainsType(file, "Bar");
  }

  {
    // In forward_merged_, database1_'s baz.proto takes precedence.
    FileDescriptorProto file;
    EXPECT_TRUE(forward_merged_.FindFileContainingExtension("Baz", 12, &file));
    EXPECT_EQ("baz.proto", file.name());
    ExpectContainsType(file, "FromPool1");
  }

  {
    // In reverse_merged_, database2_'s baz.proto takes precedence.
    FileDescriptorProto file;
    EXPECT_TRUE(reverse_merged_.FindFileContainingExtension("Baz", 12, &file));
    EXPECT_EQ("baz.proto", file.name());
    ExpectContainsType(file, "FromPool2");
  }

  {
    // Baz's extension 13 only shows up in forward_merged_ because it is
    // masked by database2_'s baz.proto in reverse_merged_.
    FileDescriptorProto file;
    EXPECT_TRUE(forward_merged_.FindFileContainingExtension("Baz", 13, &file));
    EXPECT_FALSE(reverse_merged_.FindFileContainingExtension("Baz", 13, &file));
  }

  {
    // Can't find non-existent extension.
    FileDescriptorProto file;
    EXPECT_FALSE(forward_merged_.FindFileContainingExtension("Foo", 6, &file));
  }
}